

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTState
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PointerType pdVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ostringstream errorMsg;
  assign_op<double,_double> local_231;
  undefined1 local_230 [16];
  DstEvaluatorType local_220;
  long local_208;
  VectorDynSize *local_200;
  long local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  double local_1e0;
  DstEvaluatorType local_1d8;
  SrcEvaluatorType local_1c0;
  PointerType local_1a8;
  ulong local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 local_188;
  long local_180;
  long local_170;
  undefined8 local_168;
  long local_160;
  ios_base local_138 [264];
  
  local_220.
  super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  .m_outerStride.m_value = (long)state;
  local_1e0 = time;
  uVar2 = getConstraintsDimension(this);
  uVar3 = iDynTree::MatrixDynSize::rows();
  if (uVar3 == uVar2) {
    lVar4 = iDynTree::MatrixDynSize::cols();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 == lVar5) goto LAB_00148848;
  }
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,(ulong)uVar2);
LAB_00148848:
  local_1e8 = iDynTree::MatrixDynSize::data();
  local_1f0 = iDynTree::MatrixDynSize::rows();
  local_1f8 = iDynTree::MatrixDynSize::cols();
  p_Var8 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  bVar10 = (_Rb_tree_header *)p_Var8 == p_Var9;
  if (!bVar10) {
    local_208 = 0;
    local_200 = control;
    do {
      bVar1 = ConstraintsGroup::constraintJacobianWRTState
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2),local_1e0,
                         (VectorDynSize *)
                         local_220.
                         super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                         .
                         super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                         .m_outerStride.m_value,control,
                         (MatrixDynSize *)(*(undefined8 **)(p_Var8 + 2) + 6));
      if (bVar1) {
        pdVar6 = (PointerType)iDynTree::MatrixDynSize::data();
        iDynTree::MatrixDynSize::rows();
        lVar5 = iDynTree::MatrixDynSize::cols();
        uVar2 = ConstraintsGroup::constraintsDimension
                          ((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
        local_198 = iDynTree::VectorDynSize::size();
        control = local_200;
        lVar4 = local_208;
        local_1a0 = (ulong)uVar2;
        local_1d8.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_data = (PointerType)(local_1e8 + local_208 * local_1f8 * 8);
        local_190 = local_1e8;
        local_188 = local_1f0;
        local_180 = local_1f8;
        local_170 = local_208;
        local_168 = 0;
        local_160 = local_1f8;
        local_1d8.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_outerStride.m_value = local_1f8;
        local_230._0_8_ = &local_1d8;
        local_230._8_8_ = &local_1c0;
        local_220.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_data = (PointerType)&local_231;
        local_220.
        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
        .
        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        ._8_8_ = (ostringstream *)&local_1a8;
        local_1c0.
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_data = pdVar6;
        local_1c0.
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
        .m_outerStride.m_value = lVar5;
        local_1a8 = local_1d8.
                    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    .m_data;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_230);
        local_208 = iDynTree::MatrixDynSize::rows();
        local_208 = lVar4 + local_208;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Error while evaluating constraint group ",0x28);
        ConstraintsGroup::name_abi_cxx11_
                  ((string *)local_230,(ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_230._0_8_,local_230._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
        if ((DstEvaluatorType *)local_230._0_8_ != &local_220) {
          operator_delete((void *)local_230._0_8_,
                          (ulong)((long)local_220.
                                        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                                        .
                                        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_data + 1));
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsJacobianWRTState",(char *)local_230._0_8_);
        if ((DstEvaluatorType *)local_230._0_8_ != &local_220) {
          operator_delete((void *)local_230._0_8_,
                          (ulong)((long)local_220.
                                        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                                        .
                                        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_data + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (!bVar1) {
        return bVar10;
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      bVar10 = (_Rb_tree_header *)p_Var8 == p_Var9;
    } while (!bVar10);
  }
  return bVar10;
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTState(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &jacobian)
        {
            unsigned int nc = getConstraintsDimension();
            if ((jacobian.rows() != nc) || (jacobian.cols() != state.size())) {
                jacobian.resize(nc, state.size());
            }

            iDynTreeEigenMatrixMap jacobianMap = toEigen(jacobian);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->constraintJacobianWRTState(time, state, control, group.second->stateJacobianBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint group " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                jacobianMap.block(offset, 0, group.second->group_ptr->constraintsDimension(), state.size()) = toEigen(group.second->stateJacobianBuffer);
                offset += group.second->stateJacobianBuffer.rows();
            }
            return true;
        }